

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::EmbeddingLayerParams::MergeFrom
          (EmbeddingLayerParams *this,EmbeddingLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x780d);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (EmbeddingLayerParams *)&_EmbeddingLayerParams_default_instance_) &&
     (from->weights_ != (WeightParams *)0x0)) {
    pWVar2 = mutable_weights(this);
    pWVar3 = from->weights_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  if ((from != (EmbeddingLayerParams *)&_EmbeddingLayerParams_default_instance_) &&
     (from->bias_ != (WeightParams *)0x0)) {
    pWVar2 = mutable_bias(this);
    pWVar3 = from->bias_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  if (from->inputdim_ != 0) {
    this->inputdim_ = from->inputdim_;
  }
  if (from->outputchannels_ != 0) {
    this->outputchannels_ = from->outputchannels_;
  }
  if (from->hasbias_ == true) {
    this->hasbias_ = true;
  }
  return;
}

Assistant:

void EmbeddingLayerParams::MergeFrom(const EmbeddingLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.EmbeddingLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_weights()) {
    mutable_weights()->::CoreML::Specification::WeightParams::MergeFrom(from.weights());
  }
  if (from.has_bias()) {
    mutable_bias()->::CoreML::Specification::WeightParams::MergeFrom(from.bias());
  }
  if (from.inputdim() != 0) {
    set_inputdim(from.inputdim());
  }
  if (from.outputchannels() != 0) {
    set_outputchannels(from.outputchannels());
  }
  if (from.hasbias() != 0) {
    set_hasbias(from.hasbias());
  }
}